

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QByteArray,QPalette>::emplaceValue<QPalette_const&>
          (Node<QByteArray,QPalette> *this,QPalette *args)

{
  ColorGroup CVar1;
  QPalettePrivate *pQVar2;
  long in_FS_OFFSET;
  QPalette local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QPalette::QPalette(&local_28,args);
  CVar1 = *(ColorGroup *)(this + 0x20);
  *(ColorGroup *)(this + 0x20) = local_28.currentGroup;
  pQVar2 = *(QPalettePrivate **)(this + 0x18);
  *(QPalettePrivate **)(this + 0x18) = local_28.d;
  local_28.d = pQVar2;
  local_28.currentGroup = CVar1;
  QPalette::~QPalette(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }